

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_File_Browser.cxx
# Opt level: O0

int __thiscall Fl_File_Browser::item_width(Fl_File_Browser *this,void *p)

{
  char cVar1;
  char cVar2;
  uint uVar3;
  Fl_Fontsize FVar4;
  Fl_Font face;
  int iVar5;
  int *piVar6;
  size_t sVar7;
  char *pcVar8;
  Fl_File_Icon *pFVar9;
  bool bVar10;
  double dVar11;
  int *columns;
  int local_2840;
  int column;
  int tempwidth;
  int width;
  char fragment [10240];
  char *ptr;
  char *t;
  FL_BLINE *line;
  int i;
  void *p_local;
  Fl_File_Browser *this_local;
  
  piVar6 = Fl_Browser::column_widths(&this->super_Fl_Browser);
  sVar7 = strlen((char *)((long)p + 0x23));
  if (*(char *)((long)p + sVar7 + 0x22) == '/') {
    uVar3 = Fl_Browser_::textfont((Fl_Browser_ *)this);
    FVar4 = textsize(this);
    fl_font(uVar3 | 1,FVar4);
  }
  else {
    face = Fl_Browser_::textfont((Fl_Browser_ *)this);
    FVar4 = textsize(this);
    fl_font(face,FVar4);
  }
  pcVar8 = strchr((char *)((long)p + 0x23),10);
  if (pcVar8 == (char *)0x0) {
    cVar1 = Fl_Browser::column_char(&this->super_Fl_Browser);
    pcVar8 = strchr((char *)((long)p + 0x23),(int)cVar1);
    if (pcVar8 == (char *)0x0) {
      dVar11 = fl_width((char *)((long)p + 0x23));
      column = (int)dVar11;
      goto LAB_001e07bd;
    }
  }
  column = 0;
  local_2840 = 0;
  columns._4_4_ = 0;
  fragment._10232_8_ = &tempwidth;
  for (ptr = (char *)((long)p + 0x23); *ptr != '\0'; ptr = ptr + 1) {
    if (*ptr == '\n') {
      *(undefined1 *)fragment._10232_8_ = 0;
      dVar11 = fl_width((char *)&tempwidth);
      if (column < (int)dVar11 + local_2840) {
        column = (int)dVar11 + local_2840;
      }
      local_2840 = 0;
      columns._4_4_ = 0;
      fragment._10232_8_ = &tempwidth;
    }
    else {
      cVar1 = *ptr;
      cVar2 = Fl_Browser::column_char(&this->super_Fl_Browser);
      if (cVar1 == cVar2) {
        columns._4_4_ = columns._4_4_ + 1;
        if (piVar6 == (int *)0x0) {
          iVar5 = fl_height();
          local_2840 = columns._4_4_ * (int)((double)iVar5 * 0.6 * 8.0);
        }
        else {
          line._4_4_ = 0;
          local_2840 = 0;
          while( true ) {
            bVar10 = false;
            if (line._4_4_ < columns._4_4_) {
              bVar10 = piVar6[line._4_4_] != 0;
            }
            if (!bVar10) break;
            local_2840 = piVar6[line._4_4_] + local_2840;
            line._4_4_ = line._4_4_ + 1;
          }
        }
        if (column < local_2840) {
          column = local_2840;
        }
        fragment._10232_8_ = &tempwidth;
      }
      else {
        *(char *)fragment._10232_8_ = *ptr;
        fragment._10232_8_ = fragment._10232_8_ + 1;
      }
    }
  }
  if (&tempwidth < (ulong)fragment._10232_8_) {
    *(undefined1 *)fragment._10232_8_ = 0;
    dVar11 = fl_width((char *)&tempwidth);
    if (column < (int)dVar11 + local_2840) {
      column = (int)dVar11 + local_2840;
    }
  }
LAB_001e07bd:
  pFVar9 = Fl_File_Icon::first();
  if (pFVar9 != (Fl_File_Icon *)0x0) {
    column = this->iconsize_ + 8 + column;
  }
  return column + 2;
}

Assistant:

int					// O - Width in pixels
Fl_File_Browser::item_width(void *p) const	// I - List item data
{
  int		i;			// Looping var
  FL_BLINE	*line;			// Pointer to line
  char		*t,			// Pointer into text
		*ptr,			// Pointer into fragment
		fragment[10240];	// Fragment of text
  int		width,			// Width of line
		tempwidth;		// Width of fragment
  int		column;			// Current column
  const int	*columns;		// Columns


  // Scan for newlines...
  line    = (FL_BLINE *)p;
  columns = column_widths();

  // Set the font and size...
  if (line->txt[strlen(line->txt) - 1] == '/')
    fl_font(textfont() | FL_BOLD, textsize());
  else
    fl_font(textfont(), textsize());

  if (strchr(line->txt, '\n') == NULL &&
      strchr(line->txt, column_char()) == NULL)
  {
    // Do a fast width calculation...
    width = (int)fl_width(line->txt);
  }
  else
  {
    // More than 1 line or have columns; find the maximum width...
    width     = 0;
    tempwidth = 0;
    column    = 0;

    for (t = line->txt, ptr = fragment; *t != '\0'; t ++)
      if (*t == '\n')
      {
        // Newline - nul terminate this fragment and get the width...
        *ptr = '\0';

	tempwidth += (int)fl_width(fragment);

        // Update the max width as needed...
	if (tempwidth > width)
	  width = tempwidth;

        // Point back to the start of the fragment...
	ptr       = fragment;
	tempwidth = 0;
	column    = 0;
      }
      else if (*t == column_char())
      {
        // Advance to the next column...
        column ++;
	if (columns)
	{
	  for (i = 0, tempwidth = 0; i < column && columns[i]; i ++)
	    tempwidth += columns[i];
	}
	else
          tempwidth = column * (int)(fl_height() * 0.6 * 8.0);

        if (tempwidth > width)
	  width = tempwidth;

	ptr = fragment;
      }
      else
        *ptr++ = *t;

    if (ptr > fragment)
    {
      // Nul terminate this fragment and get the width...
      *ptr = '\0';

      tempwidth += (int)fl_width(fragment);

      // Update the max width as needed...
      if (tempwidth > width)
	width = tempwidth;
    }
  }

  // If we have enabled icons then add space for them...
  if (Fl_File_Icon::first() != NULL)
    width += iconsize_ + 8;

  // Add space for the selection border..
  width += 2;

  // Return the width
  return (width);
}